

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_server.cc
# Opt level: O2

bool __thiscall raptor::TcpServer::SetUserData(TcpServer *this,ConnectionId cid,void *ptr)

{
  uint32_t uVar1;
  bool bVar2;
  shared_ptr<raptor::Connection> con;
  IAcceptor local_30;
  
  uVar1 = CheckConnectionId(this,cid);
  if (uVar1 == 0xffffffff) {
    bVar2 = false;
  }
  else {
    GetConnection((TcpServer *)&stack0xffffffffffffffd0,(uint32_t)this);
    bVar2 = (Connection *)local_30._vptr_IAcceptor != (Connection *)0x0;
    if (bVar2) {
      Connection::SetUserData((Connection *)local_30._vptr_IAcceptor,ptr);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffd8);
  }
  return bVar2;
}

Assistant:

bool TcpServer::SetUserData(ConnectionId cid, void* ptr) {
    uint32_t index = CheckConnectionId(cid);
    if (index == InvalidIndex) {
        return false;
    }

    auto con = GetConnection(index);
    if (con) {
        con->SetUserData(ptr);
        return true;
    }
    return false;
}